

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<cs::type_t&>(holder<cs::type_t> *this,type_t *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t sVar2;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0032d6e0;
  std::function<cs_impl::any_()>::function(&(this->mDat).constructor,&args->constructor);
  (this->mDat).extensions.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->extensions).super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (args->extensions).super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->mDat).extensions.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar2 = (args->id).type_hash;
  (this->mDat).id.type_idx._M_target = (args->id).type_idx._M_target;
  (this->mDat).id.type_hash = sVar2;
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}